

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O0

void __thiscall FWadFile::FindStrifeTeaserVoices(FWadFile *this)

{
  int iVar1;
  int local_18;
  uint local_14;
  int j;
  DWORD i;
  FWadFile *this_local;
  
  for (local_14 = 0; local_14 <= (this->super_FResourceFile).NumLumps; local_14 = local_14 + 1) {
    if (((this->Lumps[local_14].super_FResourceLump.field_3.Name[0] == 'V') &&
        (this->Lumps[local_14].super_FResourceLump.field_3.Name[1] == 'O')) &&
       (this->Lumps[local_14].super_FResourceLump.field_3.Name[2] == 'C')) {
      local_18 = 3;
      while ((local_18 < 8 &&
             ((this->Lumps[local_14].super_FResourceLump.field_3.Name[local_18] == '\0' ||
              (iVar1 = isdigit((int)this->Lumps[local_14].super_FResourceLump.field_3.Name[local_18]
                              ), iVar1 != 0))))) {
        local_18 = local_18 + 1;
      }
      if (local_18 == 8) {
        this->Lumps[local_14].super_FResourceLump.Namespace = 9;
      }
    }
  }
  return;
}

Assistant:

void FWadFile::FindStrifeTeaserVoices ()
{
	for (DWORD i = 0; i <= NumLumps; ++i)
	{
		if (Lumps[i].Name[0] == 'V' &&
			Lumps[i].Name[1] == 'O' &&
			Lumps[i].Name[2] == 'C')
		{
			int j;

			for (j = 3; j < 8; ++j)
			{
				if (Lumps[i].Name[j] != 0 && !isdigit(Lumps[i].Name[j]))
					break;
			}
			if (j == 8)
			{
				Lumps[i].Namespace = ns_strifevoices;
			}
		}
	}
}